

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

Expression * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::visit
          (QualifiedIdentifierResolver *this,CallOrCast *call)

{
  pool_ref<soul::AST::Expression> *e;
  CommaSeparatedList *pCVar1;
  Expression *pEVar2;
  Allocator *pAVar3;
  Scope *this_00;
  size_t sVar4;
  int iVar5;
  TypeCast *pTVar6;
  ProcessorBase *p_00;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  NameSearch search;
  pool_ptr<soul::AST::ProcessorBase> p;
  NameSearch local_160;
  Type local_a0;
  undefined1 local_88 [88];
  
  pCVar1 = (call->super_CallOrCastBase).arguments.object;
  if (pCVar1 != (CommaSeparatedList *)0x0) {
    RewritingASTVisitor::visitObject((RewritingASTVisitor *)this,&pCVar1->super_Expression);
  }
  pCVar1 = (call->super_CallOrCastBase).arguments.object;
  if ((pCVar1 != (CommaSeparatedList *)0x0) &&
     (iVar5 = (*(pCVar1->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(),
     (char)iVar5 == '\0')) {
    return (Expression *)call;
  }
  pEVar2 = (call->nameOrType).object;
  if ((pEVar2->kind == type) &&
     (iVar5 = (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[3])(), (char)iVar5 != '\0'
     )) {
    pAVar3 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.allocator;
    (*(((call->nameOrType).object)->super_Statement).super_ASTObject._vptr_ASTObject[5])(&local_a0);
    pTVar6 = convertToCast(pAVar3,call,&local_a0);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_a0.structure.object);
    return &pTVar6->super_Expression;
  }
  e = &call->nameOrType;
  if (e->object == (Expression *)0x0) {
    pTVar6 = (TypeCast *)0x0;
  }
  else {
    pTVar6 = (TypeCast *)
             __dynamic_cast(e->object,&AST::Expression::typeinfo,&AST::QualifiedIdentifier::typeinfo
                            ,0);
  }
  if (pTVar6 == (TypeCast *)0x0) {
    RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,e);
    bVar7 = true;
    goto LAB_001ee28e;
  }
  if ((*(long *)&(pTVar6->targetType).boundingSize - *(long *)&pTVar6->targetType != 0x60) ||
     (*(long *)(*(long *)&pTVar6->targetType + 0x58) != 0)) {
    RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,e);
    bVar7 = false;
    pTVar6 = (TypeCast *)call;
    goto LAB_001ee28e;
  }
  IdentifierPath::operator+
            ((IdentifierPath *)&local_160,(IdentifierPath *)&pTVar6->source,
             *(IdentifierPath **)&pTVar6->targetType);
  sVar4 = local_160.itemsFound.numActive;
  local_160.itemsFound.numActive = 0;
  if (8 < local_160.itemsFound.numAllocated) {
    if (local_160.itemsFound.items != (pool_ref<soul::AST::ASTObject> *)0x0) {
      operator_delete__(local_160.itemsFound.items);
    }
    local_160.itemsFound.items = (pool_ref<soul::AST::ASTObject> *)local_160.itemsFound.space;
    local_160.itemsFound.numAllocated = 8;
  }
  if (1 < sVar4) {
    RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,e);
  }
  bVar8 = this->parsingProcessorInstance != 0;
  bVar9 = (this->currentConnectionEndpoint).object != (SharedEndpoint *)0x0;
  local_160.itemsFound.items = (pool_ref<soul::AST::ASTObject> *)local_160.itemsFound.space;
  local_160.itemsFound.numActive = 0;
  local_160.itemsFound.numAllocated = 8;
  local_160.partiallyQualifiedPath.pathSections.items =
       (Identifier *)local_160.partiallyQualifiedPath.pathSections.space;
  local_160.partiallyQualifiedPath.pathSections.numActive = 0;
  local_160.partiallyQualifiedPath.pathSections.numAllocated = 8;
  local_160.stopAtFirstScopeWithResults = false;
  local_160.requiredNumFunctionArgs = -1;
  local_160.findVariables = true;
  local_160.findTypes = true;
  local_160.findFunctions = true;
  local_160.findNamespaces = true;
  local_160.findProcessors = true;
  local_160.findProcessorInstances = false;
  local_160.findEndpoints = true;
  local_160.onlyFindLocalVariables = false;
  IdentifierPath::operator+
            ((IdentifierPath *)local_88,(IdentifierPath *)&pTVar6->source,
             *(IdentifierPath **)&pTVar6->targetType);
  bVar7 = bVar8 || bVar9;
  ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
            (&local_160.partiallyQualifiedPath.pathSections,
             (ArrayWithPreallocation<soul::Identifier,_8UL> *)local_88);
  local_88._8_8_ = 0;
  if ((Structure *)0x8 < (ulong)local_88._16_8_) {
    if ((ProcessorBase *)local_88._0_8_ != (ProcessorBase *)0x0) {
      operator_delete__((void *)local_88._0_8_);
    }
    local_88._0_8_ = local_88 + 0x18;
    local_88._16_8_ = (Structure *)0x8;
  }
  local_160.stopAtFirstScopeWithResults = true;
  local_160._184_2_ = 0x100;
  local_160.findFunctions = false;
  local_160.findNamespaces = bVar7;
  local_160.findProcessorInstances = false;
  local_160.findEndpoints = false;
  this_00 = (pTVar6->super_Expression).super_Statement.super_ASTObject.context.parentScope;
  local_160.findProcessors = bVar7;
  if (this_00 != (Scope *)0x0) {
    AST::Scope::performFullNameSearch(this_00,&local_160,(this->currentStatement).object);
  }
  if (local_160.itemsFound.numActive == 1) {
    if (*(uint64_t *)local_160.itemsFound.items == 0) {
      pTVar6 = (TypeCast *)0x0;
    }
    else {
      pTVar6 = (TypeCast *)
               __dynamic_cast(*(uint64_t *)local_160.itemsFound.items,&AST::ASTObject::typeinfo,
                              &AST::Expression::typeinfo,0);
    }
    if (pTVar6 == (TypeCast *)0x0) {
LAB_001ee1d0:
      bVar7 = false;
    }
    else if (((pTVar6->super_Expression).kind == type) &&
            (iVar5 = (*(pTVar6->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3]
                     )(pTVar6), (char)iVar5 != '\0')) {
      pAVar3 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.allocator
      ;
      (*(pTVar6->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[5])
                (local_88,pTVar6);
      pCVar1 = (call->super_CallOrCastBase).arguments.object;
      if (pCVar1 == (CommaSeparatedList *)0x0) {
        throwInternalCompilerError("object != nullptr","operator*",0x3b);
      }
      pTVar6 = PoolAllocator::
               allocate<soul::AST::TypeCast,soul::AST::Context&,soul::Type,soul::AST::CommaSeparatedList&>
                         (&pAVar3->pool,
                          &(call->super_CallOrCastBase).super_Expression.super_Statement.
                           super_ASTObject.context,(Type *)local_88,pCVar1);
      RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_88._16_8_);
      bVar7 = true;
    }
    else {
      if (!bVar8 && !bVar9) goto LAB_001ee1d0;
      (*(pTVar6->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[6])
                (local_88,pTVar6);
      bVar7 = (ProcessorBase *)local_88._0_8_ != (ProcessorBase *)0x0;
      if (bVar7) {
        pTVar6 = (TypeCast *)resolveProcessorInstance(this,call,(ProcessorBase *)local_88._0_8_);
      }
    }
    if ((!bVar7) && (bVar8 || bVar9)) {
      if (local_160.itemsFound.numActive == 0) {
        throwInternalCompilerError("! empty()","front",0xa7);
      }
      if (*(uint64_t *)local_160.itemsFound.items == 0) {
        p_00 = (ProcessorBase *)0x0;
      }
      else {
        p_00 = (ProcessorBase *)
               __dynamic_cast(*(uint64_t *)local_160.itemsFound.items,&AST::ASTObject::typeinfo,
                              &AST::ProcessorBase::typeinfo,0);
      }
      bVar7 = p_00 != (ProcessorBase *)0x0;
      if (bVar7) {
        pTVar6 = (TypeCast *)resolveProcessorInstance(this,call,p_00);
      }
    }
  }
  else {
    bVar7 = false;
  }
  local_160.partiallyQualifiedPath.pathSections.numActive = 0;
  if (8 < local_160.partiallyQualifiedPath.pathSections.numAllocated) {
    if (local_160.partiallyQualifiedPath.pathSections.items != (Identifier *)0x0) {
      operator_delete__(local_160.partiallyQualifiedPath.pathSections.items);
    }
    local_160.partiallyQualifiedPath.pathSections.items =
         (Identifier *)local_160.partiallyQualifiedPath.pathSections.space;
    local_160.partiallyQualifiedPath.pathSections.numAllocated = 8;
  }
  local_160.itemsFound.numActive = 0;
  if ((8 < local_160.itemsFound.numAllocated) &&
     (local_160.itemsFound.items != (pool_ref<soul::AST::ASTObject> *)0x0)) {
    operator_delete__(local_160.itemsFound.items);
  }
  bVar7 = (bool)(bVar7 ^ 1);
LAB_001ee28e:
  if (bVar7) {
    return (Expression *)call;
  }
  return &pTVar6->super_Expression;
}

Assistant:

AST::Expression& visit (AST::CallOrCast& call) override
        {
            if (call.arguments != nullptr)
                visitObject (*call.arguments);

            if (call.areAllArgumentsResolved())
            {
                if (AST::isResolvedAsType (call.nameOrType.get()))
                    return convertToCast (allocator, call, call.nameOrType->resolveAsType());

                if (auto name = cast<AST::QualifiedIdentifier> (call.nameOrType))
                {
                    if (! name->isSimplePath())
                    {
                        replaceExpression (call.nameOrType);
                        return call;
                    }

                    if (name->getPath().isQualified())
                        replaceExpression (call.nameOrType);

                    bool canResolveProcessorInstance = (parsingProcessorInstance != 0 || currentConnectionEndpoint != nullptr);

                    AST::Scope::NameSearch search;
                    search.partiallyQualifiedPath = name->getPath();
                    search.stopAtFirstScopeWithResults = true;
                    search.findVariables = false;
                    search.findTypes = true;
                    search.findFunctions = false;
                    search.findNamespaces = canResolveProcessorInstance;
                    search.findProcessors = canResolveProcessorInstance;
                    search.findProcessorInstances = false;
                    search.findEndpoints = false;

                    if (auto scope = name->getParentScope())
                        scope->performFullNameSearch (search, currentStatement.get());

                    if (search.itemsFound.size() == 1)
                    {
                        if (auto e = cast<AST::Expression> (search.itemsFound.front()))
                        {
                            if (AST::isResolvedAsType (e))
                                return allocator.allocate<AST::TypeCast> (call.context, e->resolveAsType(), *call.arguments);

                            if (canResolveProcessorInstance)
                                if (auto p = e->getAsProcessor())
                                    return resolveProcessorInstance (call, *p);
                        }

                        if (canResolveProcessorInstance)
                            if (auto p = cast<AST::ProcessorBase> (search.itemsFound.front()))
                                return resolveProcessorInstance (call, *p);
                    }
                }
                else
                {
                    replaceExpression (call.nameOrType);
                }
            }

            return call;
        }